

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

CoreObject * helics::getCoreObject(HelicsCore core,HelicsError *err)

{
  CoreObject *pCVar1;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (core == (HelicsCore)0x0) {
      if (err == (HelicsError *)0x0) {
        return (CoreObject *)0x0;
      }
    }
    else {
      bVar2 = *(int *)((long)core + 0x44) == 0x378424ec;
      pCVar1 = (CoreObject *)0x0;
      if (bVar2) {
        pCVar1 = (CoreObject *)core;
      }
      if (bVar2 || err == (HelicsError *)0x0) {
        return pCVar1;
      }
    }
    err->error_code = -3;
    err->message = "core object is not valid";
  }
  return (CoreObject *)0x0;
}

Assistant:

CoreObject* getCoreObject(HelicsCore core, HelicsError* err) noexcept
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (core == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
        return nullptr;
    }
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    if (coreObj->valid == gCoreValidationIdentifier) {
        return coreObj;
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
    return nullptr;
}